

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unpacked_star_expression.cpp
# Opt level: O3

void duckdb::AddChild(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *child,expression_list_t *new_children,expression_list_t *replacements,
                     StarExpression *star,optional_ptr<duckdb_re2::RE2,_true> regex)

{
  pointer puVar1;
  bool bVar2;
  type pPVar3;
  BaseExpression *this;
  OperatorExpression *pOVar4;
  pointer pPVar5;
  ColumnRefExpression *this_00;
  pointer pPVar6;
  string *column_name;
  pointer replacement;
  optional_ptr<duckdb::ParsedExpression,_true> expr;
  optional_ptr<duckdb::ParsedExpression,_true> local_80;
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  local_78;
  optional_ptr<duckdb_re2::RE2,_true> local_70;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  *local_68;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_60;
  StarExpression *local_58;
  string local_50;
  
  local_70.ptr = regex.ptr;
  local_58 = star;
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(child);
  bVar2 = StarExpression::IsColumnsUnpacked(pPVar3);
  if (bVar2) {
    local_68 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)new_children;
    this = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->(child)->super_BaseExpression;
    pOVar4 = BaseExpression::Cast<duckdb::OperatorExpression>(this);
    local_60 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](&pOVar4->children,0);
    replacement = (replacements->
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (replacements->
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (replacement != puVar1) {
      do {
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(local_60);
        (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_78,pPVar5);
        Binder::ReplaceStarExpression
                  ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_78,replacement);
        bVar2 = StarExpression::IsColumns(&local_58->super_ParsedExpression);
        if (bVar2) {
          pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator*(replacement);
          local_80 = Binder::GetResolvedColumnExpression(pPVar3);
          if (local_80.ptr != (ParsedExpression *)0x0) {
            optional_ptr<duckdb::ParsedExpression,_true>::CheckValid(&local_80);
            this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>
                                (&(local_80.ptr)->super_BaseExpression);
            pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&local_78);
            if ((pPVar5->super_BaseExpression).alias._M_string_length == 0) {
              pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)&local_78);
              ColumnRefExpression::GetColumnName_abi_cxx11_(this_00);
              ::std::__cxx11::string::_M_assign((string *)&(pPVar5->super_BaseExpression).alias);
            }
            else {
              pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)&local_78);
              pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)&local_78);
              column_name = ColumnRefExpression::GetColumnName_abi_cxx11_(this_00);
              Binder::ReplaceColumnsAlias
                        (&local_50,&(pPVar6->super_BaseExpression).alias,column_name,local_70);
              ::std::__cxx11::string::operator=
                        ((string *)&(pPVar5->super_BaseExpression).alias,(string *)&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
            }
          }
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  (local_68,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&local_78);
        if (local_78.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_78.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        replacement = replacement + 1;
      } while (replacement != puVar1);
    }
    return;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)new_children,child);
  return;
}

Assistant:

static void AddChild(unique_ptr<ParsedExpression> &child, expression_list_t &new_children,
                     expression_list_t &replacements, StarExpression &star, optional_ptr<duckdb_re2::RE2> regex) {
	if (!StarExpression::IsColumnsUnpacked(*child)) {
		// Just add the child directly
		new_children.push_back(std::move(child));
		return;
	}
	auto &unpack = child->Cast<OperatorExpression>();
	D_ASSERT(unpack.type == ExpressionType::OPERATOR_UNPACK);
	D_ASSERT(unpack.children.size() == 1);
	auto &unpack_child = unpack.children[0];

	// Replace the child with the replacement expression(s)
	for (auto &replacement : replacements) {
		auto new_expr = unpack_child->Copy();
		Binder::ReplaceStarExpression(new_expr, replacement);
		if (StarExpression::IsColumns(star)) {
			auto expr = Binder::GetResolvedColumnExpression(*replacement);
			if (expr) {
				auto &colref = expr->Cast<ColumnRefExpression>();
				if (new_expr->GetAlias().empty()) {
					new_expr->SetAlias(colref.GetColumnName());
				} else {
					new_expr->SetAlias(
					    Binder::ReplaceColumnsAlias(new_expr->GetAlias(), colref.GetColumnName(), regex));
				}
			}
		}
		new_children.push_back(std::move(new_expr));
	}
}